

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O2

void __thiscall cppforth::Forth::cr(Forth *this)

{
  if (this->writeToTarget == ToStdCout) {
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    std::ostream::flush();
    return;
  }
  if (this->writeToTarget == ToString) {
    std::endl<char,std::char_traits<char>>((ostream *)&this->field_0x20);
    return;
  }
  return;
}

Assistant:

void cr() {
#ifndef FORTHSCRIPTCPP_DISABLE_OUTPUT
			switch (writeToTarget) {
			case ToString:
				std_cout << std::endl;
				break;
			case ToStdCout:
				std::cout << std::endl;
				std::cout.flush();
				break;
			default:
				break;
			}
#endif
		}